

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_protocol_check_outgoing_commands
              (ENetHost *host,ENetPeer *peer,ENetList *sentUnreliableCommands)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetList *pEVar3;
  ENetList *pEVar4;
  short *psVar5;
  undefined4 *puVar6;
  byte bVar7;
  ushort uVar8;
  short sVar9;
  short sVar10;
  size_t sVar11;
  _ENetListNode *p_Var12;
  _ENetListNode *p_Var13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  bool bVar25;
  ulong uVar26;
  byte bVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  _ENetListNode *p_Var31;
  ulong uVar32;
  long lVar33;
  ENetListIterator result;
  _ENetListNode *p_Var34;
  _ENetListNode *p_Var35;
  int local_78;
  long local_68;
  
  local_68 = host->commandCount * 0x30 + 0x72;
  lVar29 = host->bufferCount * 0x10 + 0x680;
  pEVar2 = &peer->outgoingCommands;
  p_Var35 = (peer->outgoingCommands).sentinel.next;
  pEVar3 = &peer->outgoingSendReliableCommands;
  pEVar4 = &peer->sentReliableCommands;
  iVar30 = 1;
  bVar25 = true;
  p_Var31 = (peer->outgoingSendReliableCommands).sentinel.next;
LAB_0010753c:
  p_Var12 = p_Var31;
LAB_00107560:
  do {
    p_Var34 = p_Var12;
    if (p_Var35 == &pEVar2->sentinel) {
      if (p_Var34 == &pEVar3->sentinel) goto LAB_0010798f;
LAB_00107590:
      p_Var31 = p_Var34->next;
    }
    else {
      if ((p_Var34 != &pEVar3->sentinel) &&
         (86399999 <
          (uint)(*(int *)((long)&p_Var34[1].previous + 4) - *(int *)((long)&p_Var35[1].previous + 4)
                ))) goto LAB_00107590;
      p_Var31 = p_Var34;
      p_Var34 = p_Var35;
      p_Var35 = p_Var35->next;
    }
    bVar7 = *(byte *)&p_Var34[2].previous;
    local_78 = iVar30;
    if (-1 < (char)bVar7) break;
    bVar27 = *(byte *)((long)&p_Var34[2].previous + 1);
    if ((ulong)bVar27 < peer->channelCount) {
      lVar33 = (long)peer->channels->reliableWindows + ((ulong)((uint)bVar27 * 0x50) - 6);
    }
    else {
      lVar33 = 0;
    }
    if (lVar33 != 0) {
      if (!bVar25) {
        bVar25 = false;
        goto LAB_0010753c;
      }
      uVar8 = *(ushort *)&p_Var34[1].next;
      if (((uVar8 & 0xfff) == 0 && *(short *)((long)&p_Var34[2].next + 6) == 0) &&
         ((0xfff < *(ushort *)(lVar33 + 6 + (ulong)((uVar8 >> 0xc) - 1 & 0xf) * 2) ||
          (bVar27 = (byte)(uVar8 >> 0xc),
          ((0x3ffU >> (0x10 - bVar27 & 0x1f) | 0x3ff << bVar27) & (uint)*(ushort *)(lVar33 + 4)) !=
          0)))) goto LAB_00107969;
    }
    local_78 = 0;
    if (p_Var34[5].previous == (_ENetListNode *)0x0) break;
    uVar28 = peer->windowSize * peer->packetThrottle >> 5;
    if (uVar28 <= peer->mtu) {
      uVar28 = peer->mtu;
    }
    p_Var12 = &pEVar3->sentinel;
  } while (uVar28 < (uint)*(ushort *)((long)&p_Var34[2].next + 4) + peer->reliableDataInTransit);
  iVar30 = local_78;
  if (lVar29 < 0xa80 && local_68 < 0x672) {
    uVar26 = commandSizes[bVar7 & 0xf];
    sVar11 = host->packetSize;
    uVar32 = peer->mtu - sVar11;
    if ((uVar26 <= uVar32) &&
       ((p_Var12 = p_Var34[5].previous, p_Var12 == (_ENetListNode *)0x0 ||
        ((uint)(ushort)(*(short *)((long)&p_Var34[2].next + 4) + (short)uVar26) <=
         ((uint)uVar32 & 0xffff))))) {
      if ((char)bVar7 < '\0') {
        bVar7 = *(byte *)((long)&p_Var34[2].previous + 1);
        if ((ulong)bVar7 < peer->channelCount) {
          lVar33 = (long)peer->channels->reliableWindows + ((ulong)((uint)bVar7 * 0x50) - 6);
        }
        else {
          lVar33 = 0;
        }
        if ((lVar33 != 0) && (*(short *)((long)&p_Var34[2].next + 6) == 0)) {
          uVar8 = *(ushort *)&p_Var34[1].next;
          *(ushort *)(lVar33 + 4) = *(ushort *)(lVar33 + 4) | (ushort)(1 << (byte)(uVar8 >> 0xc));
          psVar5 = (short *)(lVar33 + 6 + (ulong)(uVar8 >> 0xc) * 2);
          *psVar5 = *psVar5 + 1;
        }
        psVar5 = (short *)((long)&p_Var34[2].next + 6);
        *psVar5 = *psVar5 + 1;
        if (*(int *)&p_Var34[1].previous == 0) {
          *(enet_uint32 *)&p_Var34[1].previous =
               peer->roundTripTimeVariance * 4 + peer->roundTripTime;
        }
        if ((pEVar4->sentinel).next == &pEVar4->sentinel) {
          peer->nextTimeout = *(int *)&p_Var34[1].previous + host->serviceTime;
        }
        p_Var12 = p_Var34->previous;
        p_Var12->next = p_Var34->next;
        p_Var34->next->previous = p_Var12;
        p_Var12 = (peer->sentReliableCommands).sentinel.previous;
        p_Var34->previous = p_Var12;
        p_Var34->next = &pEVar4->sentinel;
        p_Var12->next = p_Var34;
        (peer->sentReliableCommands).sentinel.previous = p_Var34;
        *(enet_uint32 *)((long)&p_Var34[1].next + 4) = host->serviceTime;
        pbVar1 = (byte *)((long)&host->headerFlags + 1);
        *pbVar1 = *pbVar1 | 0x80;
        peer->reliableDataInTransit =
             peer->reliableDataInTransit + (uint)*(ushort *)((long)&p_Var34[2].next + 4);
      }
      else {
        if (((p_Var12 != (_ENetListNode *)0x0) && (*(int *)&p_Var34[2].next == 0)) &&
           (uVar28 = peer->packetThrottleCounter + 7 & 0x1f, peer->packetThrottleCounter = uVar28,
           peer->packetThrottle < uVar28)) {
          sVar9 = *(short *)&p_Var34[1].next;
          sVar10 = *(short *)((long)&p_Var34[1].next + 2);
          while( true ) {
            p_Var12 = p_Var34[5].previous;
            p_Var12->next = (_ENetListNode *)((long)&p_Var12->next[-1].previous + 7);
            if (p_Var12->next == (_ENetListNode *)0x0) {
              if (p_Var12[2].next != (_ENetListNode *)0x0) {
                (*(code *)p_Var12[2].next)(p_Var12);
              }
              (*callbacks.free)(p_Var12);
            }
            p_Var12 = p_Var34->previous;
            p_Var12->next = p_Var34->next;
            p_Var34->next->previous = p_Var12;
            (*callbacks.free)(p_Var34);
            p_Var12 = p_Var31;
            if (((p_Var35 == &pEVar2->sentinel) || (*(short *)&p_Var35[1].next != sVar9)) ||
               (*(short *)((long)&p_Var35[1].next + 2) != sVar10)) break;
            p_Var34 = p_Var35;
            p_Var35 = p_Var35->next;
          }
          goto LAB_00107560;
        }
        p_Var13 = p_Var34->previous;
        p_Var13->next = p_Var34->next;
        p_Var34->next->previous = p_Var13;
        if (p_Var12 != (_ENetListNode *)0x0) {
          p_Var12 = (sentUnreliableCommands->sentinel).previous;
          p_Var34->previous = p_Var12;
          p_Var34->next = &sentUnreliableCommands->sentinel;
          p_Var12->next = p_Var34;
          (sentUnreliableCommands->sentinel).previous = p_Var34;
        }
      }
      *(long *)((long)host->commands + lVar29 + -0x72) = (long)host->commands + local_68 + -0x72;
      *(ulong *)((long)host->commands + lVar29 + -0x6a) = uVar26;
      host->packetSize = sVar11 + uVar26;
      uVar14 = *(undefined4 *)&p_Var34[2].previous;
      uVar15 = *(undefined4 *)((long)&p_Var34[2].previous + 4);
      uVar16 = *(undefined4 *)&p_Var34[3].next;
      uVar17 = *(undefined4 *)((long)&p_Var34[3].next + 4);
      uVar18 = *(undefined4 *)&p_Var34[3].previous;
      uVar19 = *(undefined4 *)((long)&p_Var34[3].previous + 4);
      uVar20 = *(undefined4 *)&p_Var34[4].next;
      uVar21 = *(undefined4 *)((long)&p_Var34[4].next + 4);
      uVar22 = *(undefined4 *)((long)&p_Var34[4].previous + 4);
      uVar23 = *(undefined4 *)&p_Var34[5].next;
      uVar24 = *(undefined4 *)((long)&p_Var34[5].next + 4);
      puVar6 = (undefined4 *)((long)host->commands + local_68 + -0x52);
      *puVar6 = *(undefined4 *)&p_Var34[4].previous;
      puVar6[1] = uVar22;
      puVar6[2] = uVar23;
      puVar6[3] = uVar24;
      puVar6 = (undefined4 *)((long)host->commands + local_68 + -0x62);
      *puVar6 = uVar18;
      puVar6[1] = uVar19;
      puVar6[2] = uVar20;
      puVar6[3] = uVar21;
      puVar6 = (undefined4 *)((long)host->commands + local_68 + -0x72);
      *puVar6 = uVar14;
      puVar6[1] = uVar15;
      puVar6[2] = uVar16;
      puVar6[3] = uVar17;
      if (p_Var34[5].previous == (_ENetListNode *)0x0) {
        if (-1 < *(char *)&p_Var34[2].previous) {
          (*callbacks.free)(p_Var34);
        }
      }
      else {
        *(ulong *)((long)host->commands + lVar29 + -0x62) =
             (long)&(p_Var34[5].previous[1].next)->next + (ulong)*(uint *)&p_Var34[2].next;
        uVar26 = (ulong)*(ushort *)((long)&p_Var34[2].next + 4);
        *(ulong *)((long)host->commands + lVar29 + -0x5a) = uVar26;
        lVar29 = lVar29 + 0x10;
        host->packetSize = host->packetSize + uVar26;
      }
      peer->packetsSent = peer->packetsSent + 1;
      peer->totalPacketsSent = peer->totalPacketsSent + 1;
      local_68 = local_68 + 0x30;
      lVar29 = lVar29 + 0x10;
      goto LAB_0010753c;
    }
  }
  *(byte *)&peer->flags = (byte)peer->flags | 2;
LAB_0010798f:
  host->commandCount = (local_68 + -0x72 >> 4) * -0x5555555555555555;
  host->bufferCount = lVar29 + -0x680 >> 4;
  if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
      ((pEVar2->sentinel).next == &pEVar2->sentinel)) &&
     (((pEVar3->sentinel).next == &pEVar3->sentinel &&
      (((peer->sentReliableCommands).sentinel.next == &pEVar4->sentinel &&
       ((sentUnreliableCommands->sentinel).next == &sentUnreliableCommands->sentinel)))))) {
    enet_peer_disconnect(peer,peer->eventData);
  }
  return iVar30;
LAB_00107969:
  bVar25 = false;
  p_Var31 = &pEVar3->sentinel;
  goto LAB_0010753c;
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost *host, ENetPeer *peer, ENetList *sentUnreliableCommands) {
        ENetProtocol *command = &host->commands[host->commandCount];
        ENetBuffer *buffer    = &host->buffers[host->bufferCount];
        ENetOutgoingCommand *outgoingCommand = NULL;
        ENetListIterator currentCommand, currentSendReliableCommand;
        ENetChannel *channel = NULL;
        enet_uint16 reliableWindow = 0;
        size_t commandSize=0;
        int windowWrap = 0, canPing = 1;

        currentCommand = enet_list_begin(&peer->outgoingCommands);
        currentSendReliableCommand = enet_list_begin (&peer->outgoingSendReliableCommands);

        for (;;) {
            if (currentCommand != enet_list_end (& peer->outgoingCommands))
            {
                outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands) && ENET_TIME_LESS (((ENetOutgoingCommand *) currentSendReliableCommand)->queueTime, outgoingCommand->queueTime)) {
                    goto useSendReliableCommand;
                }
                currentCommand = enet_list_next (currentCommand);
            } else if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands)) {
                useSendReliableCommand:
                outgoingCommand = (ENetOutgoingCommand *) currentSendReliableCommand;
                currentSendReliableCommand = enet_list_next (currentSendReliableCommand);
            } else {
                break;
            }


            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL) {
                    if (windowWrap) {
                        continue;
                    } else if (outgoingCommand->sendAttempts < 1 && 
                            !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
                            (channel->reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                            channel->usedReliableWindows & ((((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | 
                            (((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow))))) 
                    {
                        windowWrap = 1;
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                if (outgoingCommand->packet != NULL) {
                    enet_uint32 windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX (windowSize, peer->mtu))
                    {
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                canPing = 0;
            }

            commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];
            if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] ||
                buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] ||
                peer->mtu - host->packetSize < commandSize ||
                (outgoingCommand->packet != NULL &&
                (enet_uint16) (peer->mtu - host->packetSize) < (enet_uint16) (commandSize + outgoingCommand->fragmentLength))
            ) {
                peer->flags |= ENET_PEER_FLAG_CONTINUE_SENDING;
                break;
            }

            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL && outgoingCommand->sendAttempts < 1) {
                    channel->usedReliableWindows |= 1u << reliableWindow;
                    ++channel->reliableWindows[reliableWindow];
                }

                ++outgoingCommand->sendAttempts;

                if (outgoingCommand->roundTripTimeout == 0) {
                    outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
                }

                if (enet_list_empty(&peer->sentReliableCommands)) {
                    peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;
                }

                enet_list_insert(enet_list_end(&peer->sentReliableCommands), enet_list_remove(&outgoingCommand->outgoingCommandList));

                outgoingCommand->sentTime = host->serviceTime;

                host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
                peer->reliableDataInTransit += outgoingCommand->fragmentLength;
            } else {
                if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0) {
                    peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
                    peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->packetThrottleCounter > peer->packetThrottle) {
                        enet_uint16 reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,
                                    unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;
                        for (;;)
                        {
                            --outgoingCommand->packet->referenceCount;

                            if (outgoingCommand->packet->referenceCount == 0) {
                                enet_packet_destroy(outgoingCommand->packet);
                            }

                            enet_list_remove(& outgoingCommand->outgoingCommandList);
                            enet_free(outgoingCommand);

                            if (currentCommand == enet_list_end (& peer->outgoingCommands)) {
                                break;
                            }

                            outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                            if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber ||
                                outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber) {
                                break;
                            }

                            currentCommand = enet_list_next(currentCommand);
                        }

                        continue;
                    }
                }

                enet_list_remove(&outgoingCommand->outgoingCommandList);

                if (outgoingCommand->packet != NULL) {
                    enet_list_insert(enet_list_end (sentUnreliableCommands), outgoingCommand);
                }
            }


            buffer->data       = command;
            buffer->dataLength = commandSize;

            host->packetSize  += buffer->dataLength;

            *command = outgoingCommand->command;

            if (outgoingCommand->packet != NULL) {
                ++buffer;
                buffer->data       = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
                buffer->dataLength = outgoingCommand->fragmentLength;
                host->packetSize += outgoingCommand->fragmentLength;
            } else if(! (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
                enet_free(outgoingCommand);
            }

            ++peer->packetsSent;
            ++peer->totalPacketsSent;

            ++command;
            ++buffer;
        }

        host->commandCount = command - host->commands;
        host->bufferCount  = buffer - host->buffers;

        if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER &&
            !enet_peer_has_outgoing_commands (peer) &&
            enet_list_empty (sentUnreliableCommands)) {
                enet_peer_disconnect (peer, peer->eventData);
            }

        return canPing;
    }